

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGuiTextFilter::Build(ImGuiTextFilter *this)

{
  uint uVar1;
  TextRange *pTVar2;
  char *pcVar3;
  TextRange *__dest;
  size_t sVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  TextRange input_range;
  TextRange local_30;
  
  if ((this->Filters).Capacity < 0) {
    GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
    __dest = (TextRange *)(*GImAllocatorAllocFunc)(0,GImAllocatorUserData);
    pTVar2 = (this->Filters).Data;
    if (pTVar2 != (TextRange *)0x0) {
      memcpy(__dest,pTVar2,(long)(this->Filters).Size << 4);
      pTVar2 = (this->Filters).Data;
      if (pTVar2 != (TextRange *)0x0) {
        GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
      }
      (*GImAllocatorFreeFunc)(pTVar2,GImAllocatorUserData);
    }
    (this->Filters).Data = __dest;
    (this->Filters).Capacity = 0;
  }
  (this->Filters).Size = 0;
  sVar4 = strlen(this->InputBuf);
  local_30.e = this->InputBuf + sVar4;
  local_30.b = this->InputBuf;
  TextRange::split(&local_30,',',&this->Filters);
  this->CountGrep = 0;
  uVar1 = (this->Filters).Size;
  uVar5 = (ulong)uVar1;
  if (uVar1 != 0) {
    lVar6 = 0;
    uVar7 = 0;
    do {
      if ((long)(int)uVar5 <= (long)uVar7) {
LAB_00173f5c:
        __assert_fail("i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                      ,0x4c0,
                      "value_type &ImVector<ImGuiTextFilter::TextRange>::operator[](int) [T = ImGuiTextFilter::TextRange]"
                     );
      }
      TextRange::trim_blanks((TextRange *)((long)&((this->Filters).Data)->b + lVar6));
      uVar1 = (this->Filters).Size;
      uVar5 = (ulong)(int)uVar1;
      if ((long)uVar5 <= (long)uVar7) goto LAB_00173f5c;
      pTVar2 = (this->Filters).Data;
      pcVar3 = *(char **)((long)&pTVar2->b + lVar6);
      if ((pcVar3 != *(char **)((long)&pTVar2->e + lVar6)) && (*pcVar3 != '-')) {
        this->CountGrep = this->CountGrep + 1;
      }
      uVar7 = uVar7 + 1;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 != uVar1);
  }
  return;
}

Assistant:

void ImGuiTextFilter::Build()
{
    Filters.resize(0);
    TextRange input_range(InputBuf, InputBuf+strlen(InputBuf));
    input_range.split(',', Filters);

    CountGrep = 0;
    for (int i = 0; i != Filters.Size; i++)
    {
        Filters[i].trim_blanks();
        if (Filters[i].empty())
            continue;
        if (Filters[i].front() != '-')
            CountGrep += 1;
    }
}